

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# float_conversion.cc
# Opt level: O2

bool absl::str_format_internal::(anonymous_namespace)::
     FloatToBuffer<(absl::str_format_internal::(anonymous_namespace)::FormatStyle)1,long_double>
               (Decomposed<long_double> decomposed,size_t precision,Buffer *out,int *exp)

{
  undefined1 auVar1 [16];
  undefined1 digits [16];
  char cVar2;
  size_t sVar3;
  ulong uVar4;
  byte bVar5;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  size_t sVar9;
  ulong uVar10;
  uint uVar11;
  ulong uVar12;
  long lVar13;
  bool bVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 uVar17;
  undefined4 in_stack_ffffffffffffffbc;
  undefined4 uVar18;
  undefined8 in_stack_ffffffffffffffc0;
  
  if (0x27 < precision) {
    return false;
  }
  out->end = out->data + 0x29;
  out->begin = out->data + 0x29;
  if (-1 < decomposed.exponent) {
    if (decomposed.exponent == 0) {
      sVar3 = PrintIntegralDigits<(absl::str_format_internal::(anonymous_namespace)::FormatStyle)1,unsigned_long>
                        (decomposed.mantissa.lo_,out);
      uVar4 = sVar3 - 1;
      *exp = (int)uVar4;
      sVar9 = uVar4 - precision;
      if (uVar4 < precision || sVar9 == 0) {
        for (lVar13 = ~precision + sVar3; lVar13 != 0; lVar13 = lVar13 + 1) {
          anon_unknown_0::Buffer::push_back(out,'0');
        }
        return true;
      }
    }
    else {
LAB_0014c860:
      if (decomposed.exponent < 0) {
        if ((uint)decomposed.exponent < 0xffffff84) {
          return false;
        }
        uVar11 = -decomposed.exponent;
        uVar7 = uVar11 & 0xff;
        auVar15 = __ashlti3(0xffffffffffffffff,0xffffffffffffffff);
        uVar4 = ~auVar15._0_8_;
        uVar12 = ~auVar15._8_8_;
        auVar16 = __lshrti3(decomposed.mantissa.lo_,decomposed.mantissa.hi_,uVar7);
        auVar15._4_4_ = in_stack_ffffffffffffffbc;
        auVar15._0_4_ = uVar7;
        auVar15._8_8_ = exp;
        sVar9 = PrintIntegralDigits<(absl::str_format_internal::(anonymous_namespace)::FormatStyle)1,unsigned__int128>
                          (auVar16._0_8_,(unsigned___int128)auVar15,auVar16._8_8_);
        uVar17 = (undefined4)uVar12;
        uVar18 = (undefined4)(uVar12 >> 0x20);
        uVar8 = decomposed.mantissa.hi_ & uVar12;
        uVar10 = decomposed.mantissa.lo_ & uVar4;
        if (sVar9 == 0) {
          *exp = 0;
          iVar6 = 0;
          if (uVar10 == 0 && uVar8 == 0) {
            uVar10 = 0;
            uVar8 = 0;
          }
          else {
            for (; uVar8 <= uVar12 && (ulong)(uVar4 < uVar10) <= uVar12 - uVar8;
                uVar8 = uVar8 * 10 + SUB168(auVar16 * ZEXT816(10),8)) {
              auVar16._8_8_ = 0;
              auVar16._0_8_ = uVar10;
              uVar10 = SUB168(auVar16 * ZEXT816(10),0);
              iVar6 = iVar6 + -1;
            }
            *exp = iVar6;
          }
          cVar2 = __lshrti3(uVar10,uVar8,uVar11 & 0xff);
          anon_unknown_0::Buffer::push_front(out,cVar2 + '0');
          anon_unknown_0::Buffer::push_back(out,'.');
          uVar10 = uVar10 & uVar4;
          uVar8 = uVar8 & CONCAT44(uVar18,uVar17);
        }
        else {
          uVar12 = sVar9 - 1;
          *exp = (int)uVar12;
          sVar9 = uVar12 - precision;
          if (precision <= uVar12 && sVar9 != 0) {
            bVar14 = uVar10 == 0 && uVar8 == 0;
            goto LAB_0014c975;
          }
          precision = precision - uVar12;
        }
        while( true ) {
          auVar1._8_8_ = 0;
          auVar1._0_8_ = uVar10;
          uVar10 = SUB168(auVar1 * ZEXT816(10),0);
          uVar8 = uVar8 * 10 + SUB168(auVar1 * ZEXT816(10),8);
          cVar2 = __lshrti3(uVar10,uVar8,uVar11 & 0xff);
          uVar10 = uVar10 & uVar4;
          uVar8 = uVar8 & CONCAT44(uVar18,uVar17);
          bVar14 = precision == 0;
          precision = precision - 1;
          if (bVar14) break;
          anon_unknown_0::Buffer::push_back(out,cVar2 + '0');
        }
        if ('\x05' < cVar2) goto LAB_0014cb2a;
        if (cVar2 != '\x05') {
          return true;
        }
        if (uVar10 != 0 || uVar8 != 0) goto LAB_0014cb2a;
        goto LAB_0014cb0d;
      }
      if (0x40 < (uint)decomposed.exponent) {
        return false;
      }
      auVar15 = __ashlti3(decomposed.mantissa.lo_,decomposed.mantissa.hi_,decomposed.exponent & 0xff
                         );
      digits._4_4_ = in_stack_ffffffffffffffbc;
      digits._0_4_ = in_stack_ffffffffffffffb8;
      digits._8_8_ = in_stack_ffffffffffffffc0;
      sVar3 = PrintIntegralDigits<(absl::str_format_internal::(anonymous_namespace)::FormatStyle)1,unsigned__int128>
                        (auVar15._0_8_,(unsigned___int128)digits,auVar15._8_8_);
      uVar4 = sVar3 - 1;
      *exp = (int)uVar4;
      sVar9 = uVar4 - precision;
      if (uVar4 < precision || sVar9 == 0) {
        for (lVar13 = ~precision + sVar3; lVar13 != 0; lVar13 = lVar13 + 1) {
          anon_unknown_0::Buffer::push_back(out,'0');
        }
        return true;
      }
    }
    bVar14 = false;
LAB_0014c97c:
    anon_unknown_0::RemoveExtraPrecision(sVar9,bVar14,out,exp);
    return true;
  }
  if ((uint)decomposed.exponent < 0xffffffc4) goto LAB_0014c860;
  bVar5 = -(char)decomposed.exponent;
  uVar10 = ~(-1L << (bVar5 & 0x3f));
  sVar9 = PrintIntegralDigits<(absl::str_format_internal::(anonymous_namespace)::FormatStyle)1,unsigned_long>
                    (decomposed.mantissa.lo_ >> (bVar5 & 0x3f),out);
  uVar4 = decomposed.mantissa.lo_ & uVar10;
  if (sVar9 == 0) {
    *exp = 0;
    iVar6 = 0;
    if (uVar4 == 0) {
      uVar4 = 0;
    }
    else {
      for (; uVar4 <= uVar10; uVar4 = uVar4 * 10) {
        iVar6 = iVar6 + -1;
      }
      *exp = iVar6;
    }
    anon_unknown_0::Buffer::push_front(out,(char)(uVar4 >> (bVar5 & 0x3f)) + '0');
    anon_unknown_0::Buffer::push_back(out,'.');
    uVar4 = uVar4 & uVar10;
  }
  else {
    uVar8 = sVar9 - 1;
    *exp = (int)uVar8;
    sVar9 = uVar8 - precision;
    if (precision <= uVar8 && sVar9 != 0) {
      bVar14 = uVar4 == 0;
LAB_0014c975:
      bVar14 = !bVar14;
      goto LAB_0014c97c;
    }
    precision = precision - uVar8;
  }
  while( true ) {
    uVar8 = uVar4 * 10;
    uVar4 = uVar8 & uVar10;
    bVar14 = precision == 0;
    precision = precision - 1;
    cVar2 = (char)(uVar8 >> (bVar5 & 0x3f));
    if (bVar14) break;
    anon_unknown_0::Buffer::push_back(out,cVar2 + '0');
  }
  if ('\x05' < cVar2) goto LAB_0014cb2a;
  if (cVar2 != '\x05') {
    return true;
  }
  if (uVar4 != 0) goto LAB_0014cb2a;
LAB_0014cb0d:
  cVar2 = out->end[-1];
  if (cVar2 == '.') {
    cVar2 = out->end[-2];
  }
  if (((int)cVar2 & 0x80000001U) != 1) {
    return true;
  }
LAB_0014cb2a:
  anon_unknown_0::RoundUp<(absl::str_format_internal::(anonymous_namespace)::FormatStyle)1>(out,exp)
  ;
  return true;
}

Assistant:

bool FloatToBuffer(Decomposed<Float> decomposed,
                   size_t precision,
                   Buffer* out,
                   int* exp) {
  if (precision > kMaxFixedPrecision) return false;

  // Try with uint64_t.
  if (CanFitMantissa<Float, std::uint64_t>() &&
      FloatToBufferImpl<std::uint64_t, Float, mode>(
          static_cast<std::uint64_t>(decomposed.mantissa), decomposed.exponent,
          precision, out, exp))
    return true;

#if defined(ABSL_HAVE_INTRINSIC_INT128)
  // If that is not enough, try with __uint128_t.
  return CanFitMantissa<Float, __uint128_t>() &&
         FloatToBufferImpl<__uint128_t, Float, mode>(
             static_cast<__uint128_t>(decomposed.mantissa), decomposed.exponent,
             precision, out, exp);
#endif
  return false;
}